

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# talg.c
# Opt level: O0

int invertroot(int q,double *ma)

{
  double dVar1;
  double dVar2;
  int DEGREE;
  int iVar3;
  double *coeff;
  double *ZEROR;
  double *ZEROI;
  void *__ptr;
  undefined8 *__ptr_00;
  undefined8 *__ptr_01;
  undefined8 *__ptr_02;
  undefined8 *__ptr_03;
  double dVar4;
  double dVar5;
  double tempi;
  double tempr;
  double mod;
  int *ind;
  double *yi;
  double *yr;
  double *xi;
  double *xr;
  double *zeroi;
  double *zeror;
  double *temp;
  int j;
  int i1;
  int qn;
  int rcheck;
  int fail;
  int retval;
  int index;
  int i;
  double *ma_local;
  int q_local;
  
  fail = -1;
  for (retval = 0; retval < q; retval = retval + 1) {
    if ((ma[retval] != 0.0) || (NAN(ma[retval]))) {
      fail = retval;
    }
  }
  if (fail == -1) {
    ma_local._4_4_ = 0;
  }
  else {
    coeff = (double *)malloc((long)(q + 1) << 3);
    ZEROR = (double *)malloc((long)q << 3);
    ZEROI = (double *)malloc((long)q << 3);
    __ptr = malloc((long)q << 2);
    DEGREE = fail + 1;
    *coeff = 1.0;
    for (retval = 1; retval <= DEGREE; retval = retval + 1) {
      coeff[retval] = ma[retval + -1];
    }
    __ptr_00 = (undefined8 *)malloc((long)(fail + 2) << 3);
    __ptr_01 = (undefined8 *)malloc((long)(fail + 2) << 3);
    __ptr_02 = (undefined8 *)malloc((long)(fail + 2) << 3);
    __ptr_03 = (undefined8 *)malloc((long)(fail + 2) << 3);
    iVar3 = polyroot(coeff,DEGREE,ZEROR,ZEROI);
    if (iVar3 == 1) {
      free(ZEROR);
      free(ZEROI);
      free(coeff);
      free(__ptr);
      free(__ptr_00);
      free(__ptr_01);
      free(__ptr_02);
      free(__ptr_03);
      ma_local._4_4_ = 0;
    }
    else {
      i1 = 0;
      for (retval = 0; retval < DEGREE; retval = retval + 1) {
        dVar4 = ZEROR[retval];
        dVar5 = ZEROR[retval];
        dVar1 = ZEROI[retval];
        dVar2 = ZEROI[retval];
        *(undefined4 *)((long)__ptr + (long)retval * 4) = 0;
        if (dVar4 * dVar5 + dVar1 * dVar2 < 1.0) {
          *(undefined4 *)((long)__ptr + (long)retval * 4) = 1;
          i1 = i1 + 1;
        }
      }
      if (i1 == 0) {
        free(ZEROR);
        free(ZEROI);
        free(coeff);
        free(__ptr);
        free(__ptr_00);
        free(__ptr_01);
        free(__ptr_02);
        free(__ptr_03);
        ma_local._4_4_ = 0;
      }
      else if (DEGREE == 1) {
        *ma = 1.0 / *ma;
        for (retval = 1; retval < q; retval = retval + 1) {
          ma[retval] = 0.0;
        }
        free(ZEROR);
        free(ZEROI);
        free(coeff);
        free(__ptr);
        free(__ptr_00);
        free(__ptr_01);
        free(__ptr_02);
        free(__ptr_03);
        ma_local._4_4_ = 1;
      }
      else {
        for (retval = 0; retval < DEGREE; retval = retval + 1) {
          if (*(int *)((long)__ptr + (long)retval * 4) == 1) {
            dVar4 = ZEROR[retval] * ZEROR[retval] + ZEROI[retval] * ZEROI[retval];
            ZEROR[retval] = ZEROR[retval] / dVar4;
            ZEROI[retval] = -ZEROI[retval] / dVar4;
          }
        }
        *__ptr_00 = 0x3ff0000000000000;
        *__ptr_01 = 0;
        *__ptr_02 = *__ptr_00;
        *__ptr_03 = *__ptr_01;
        for (retval = 0; retval < DEGREE; retval = retval + 1) {
          iVar3 = retval + 1;
          dVar5 = ZEROR[retval] * ZEROR[retval] + ZEROI[retval] * ZEROI[retval];
          dVar4 = ZEROR[retval] / dVar5;
          dVar5 = -ZEROI[retval] / dVar5;
          __ptr_01[iVar3] = 0;
          __ptr_00[iVar3] = 0;
          for (temp._0_4_ = 1; (int)temp <= iVar3; temp._0_4_ = (int)temp + 1) {
            __ptr_02[(int)temp] =
                 dVar4 * (double)__ptr_00[(int)temp + -1] +
                 -(dVar5 * (double)__ptr_01[(int)temp + -1]);
            __ptr_03[(int)temp] =
                 dVar4 * (double)__ptr_01[(int)temp + -1] + dVar5 * (double)__ptr_00[(int)temp + -1]
            ;
            __ptr_02[(int)temp] = (double)__ptr_00[(int)temp] - (double)__ptr_02[(int)temp];
            __ptr_03[(int)temp] = (double)__ptr_01[(int)temp] - (double)__ptr_03[(int)temp];
          }
          for (temp._0_4_ = 1; (int)temp <= iVar3; temp._0_4_ = (int)temp + 1) {
            __ptr_00[(int)temp] = __ptr_02[(int)temp];
            __ptr_01[(int)temp] = __ptr_03[(int)temp];
          }
        }
        for (retval = 0; retval < DEGREE; retval = retval + 1) {
          ma[retval] = (double)__ptr_00[retval + 1];
        }
        while (retval = DEGREE, retval < q) {
          ma[retval] = 0.0;
          DEGREE = retval + 1;
        }
        free(ZEROR);
        free(ZEROI);
        free(coeff);
        free(__ptr);
        free(__ptr_00);
        free(__ptr_01);
        free(__ptr_02);
        free(__ptr_03);
        ma_local._4_4_ = 1;
      }
    }
  }
  return ma_local._4_4_;
}

Assistant:

int invertroot(int q, double *ma) {
	int i, index, retval, fail, rcheck, qn, i1, j;
	double *temp, *zeror, *zeroi, *xr, *xi,*yr,*yi;
	int *ind;
	double mod,tempr,tempi;


	retval = 0;
	index = -1;
	for (i = 0; i < q; ++i) {
		if (ma[i] != 0.0) {
			index = i;
		}
	}

	if (index == -1) {
		return retval;
	}
	
	temp = (double*)malloc(sizeof(double)* (q + 1));
	zeror = (double*)malloc(sizeof(double)* q);
	zeroi = (double*)malloc(sizeof(double)* q);
	ind = (int*)malloc(sizeof(int)* q);

	index++;
	temp[0] = 1.0;
	for (i = 1; i <= index; ++i) {
		temp[i] = ma[i - 1];
	}

	qn = index;

	xr = (double*)malloc(sizeof(double)* (qn + 1));
	xi = (double*)malloc(sizeof(double)* (qn + 1));
	yr = (double*)malloc(sizeof(double)* (qn + 1));
	yi = (double*)malloc(sizeof(double)* (qn + 1));

	fail = polyroot(temp, qn, zeror, zeroi);

	//mdisplay(zeroi, 1, qn);

	if (fail == 1) {
		free(zeror);
		free(zeroi);
		free(temp);
		free(ind);
		free(xr);
		free(xi);
		free(yr);
		free(yi);
		return retval;
	}

	rcheck = 0;

	for (i = 0; i < qn; ++i) {
		mod = zeror[i] * zeror[i] + zeroi[i] * zeroi[i];
		ind[i] = 0;
		if (mod < 1.0) {
			ind[i] = 1;
			rcheck++;
		}
	}

	if (rcheck == 0) {
		free(zeror);
		free(zeroi);
		free(temp);
		free(ind);
		free(xr);
		free(xi);
		free(yr);
		free(yi);
		return retval;
	}
	else {
		retval = 1;
	}

	if (index == 1) {
		ma[0] = 1.0 / ma[0];
		for (i = 1; i < q; ++i) {
			ma[i] = 0.0;
		}
		free(zeror);
		free(zeroi);
		free(temp);
		free(ind);
		free(xr);
		free(xi);
		free(yr);
		free(yi);
		return retval;
	}

	for (i = 0; i < index; ++i) {
		if (ind[i] == 1) {
			mod = zeror[i] * zeror[i] + zeroi[i] * zeroi[i];
			zeror[i] = zeror[i] / mod;
			zeroi[i] = -zeroi[i] / mod;
		}
	}

	//mdisplay(zeroi, 1, qn);

	xr[0] = 1.0; xi[0] = 0.0;
	yr[0] = xr[0];
	yi[0] = xi[0];

	for (i = 0; i < qn; ++i) {
		i1 = i + 1;
		mod = zeror[i] * zeror[i] + zeroi[i] * zeroi[i];
		tempr = zeror[i] / mod;
		tempi = -zeroi[i] / mod;
		xr[i1] = xi[i1] = 0.0;
		for (j = 1; j <= i1; ++j) {
			yr[j] = tempr * xr[j - 1] - tempi * xi[j - 1];
			yi[j] = tempr * xi[j - 1] + tempi * xr[j - 1];
			yr[j] = xr[j] - yr[j];
			yi[j] = xi[j] - yi[j];
		}
		for (j = 1; j <= i1; ++j) {
			xr[j] = yr[j];
			xi[j] = yi[j];
		}
		//mdisplay(xr, 1, qn+1);
	}

	for (i = 0; i < qn; ++i) {
		ma[i] = xr[i+1];
	}

	for (i = qn; i < q; ++i) {
		ma[i] = 0.0;
	}

	free(zeror);
	free(zeroi);
	free(temp);
	free(ind);
	free(xr);
	free(xi);
	free(yr);
	free(yi);
	return retval;
}